

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

void __thiscall SSTableCache::SSTableCache(SSTableCache *this,string *_fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint64_t *puVar2;
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  undefined8 uVar5;
  runtime_error *this_00;
  long *plVar6;
  _WordT *p_Var7;
  ulong uVar8;
  int offset;
  ifstream in;
  uint64_t key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a58;
  long local_2a38 [4];
  byte abStack_2a18 [488];
  BloomFilter local_2830;
  
  __rhs = &this->fileName;
  paVar3 = &(this->fileName).field_2;
  memset(this,0,0x2838);
  (this->fileName)._M_dataplus._M_p = (pointer)paVar3;
  pcVar4 = (_fileName->_M_dataplus)._M_p;
  paVar1 = &_fileName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&_fileName->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fileName).field_2 + 8) = uVar5;
  }
  else {
    (__rhs->_M_dataplus)._M_p = pcVar4;
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->fileName)._M_string_length = _fileName->_M_string_length;
  (_fileName->_M_dataplus)._M_p = (pointer)paVar1;
  _fileName->_M_string_length = 0;
  (_fileName->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_2a38,(string *)__rhs,_S_in|_S_bin);
  if ((abStack_2a18[*(long *)(local_2a38[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_2a38,(long)this);
    puVar2 = &(this->header).length;
    std::istream::read((char *)local_2a38,(long)puVar2);
    std::istream::read((char *)local_2a38,(long)&(this->header).minKey);
    std::istream::read((char *)local_2a38,(long)&(this->header).maxKey);
    BloomFilter::BloomFilter(&local_2830,(ifstream *)local_2a38);
    memcpy(&this->bloomFilter,&local_2830,0x2800);
    std::istream::seekg((long)local_2a38,0x2820);
    if (*puVar2 != 0) {
      uVar8 = 0;
      do {
        std::istream::read((char *)local_2a38,(long)&local_2830);
        std::istream::read((char *)local_2a38,(long)&local_2a58);
        std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
        emplace_back<unsigned_long&,int&>
                  ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                    *)&this->index,(unsigned_long *)&local_2830,(int *)&local_2a58);
        uVar8 = uVar8 + 1;
      } while (uVar8 < *puVar2);
    }
    std::istream::read((char *)local_2a38,(long)&local_2830);
    std::istream::read((char *)local_2a38,(long)&local_2a58);
    std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
    emplace_back<unsigned_long&,int&>
              ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
               &this->index,(unsigned_long *)&local_2830,(int *)&local_2a58);
    std::ifstream::close();
    std::ifstream::~ifstream(local_2a38);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_2a58,"readHeader: Open file ",__rhs);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a58);
  local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = *plVar6;
  p_Var7 = (_WordT *)(plVar6 + 2);
  if ((_WordT *)local_2830.bits.super__Base_bitset<1280UL>._M_w[0] == p_Var7) {
    local_2830.bits.super__Base_bitset<1280UL>._M_w[2] = *p_Var7;
    local_2830.bits.super__Base_bitset<1280UL>._M_w[3] = plVar6[3];
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] =
         (_WordT)(local_2830.bits.super__Base_bitset<1280UL>._M_w + 2);
  }
  else {
    local_2830.bits.super__Base_bitset<1280UL>._M_w[2] = *p_Var7;
  }
  local_2830.bits.super__Base_bitset<1280UL>._M_w[1] = plVar6[1];
  *plVar6 = (long)p_Var7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_2830);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SSTableCache::SSTableCache(string _fileName) : fileName(std::move(_fileName)) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readHeader: Open file " + fileName + " failed!");

  SSTable::read64(in, header.timeStamp);
  SSTable::read64(in, header.length);
  SSTable::read64(in, header.minKey);
  SSTable::read64(in, header.maxKey);

  bloomFilter = BloomFilter(in);

  in.seekg(32 + 10240, ifstream::beg);

  uint64_t key;
  int offset;
  for (uint64_t i = 0; i < header.length; i++) {
    SSTable::read64(in, key);
    SSTable::read32(in, offset);
    index.emplace_back(key, offset);
  }
  SSTable::read64(in, key);
  SSTable::read32(in, offset);
  index.emplace_back(key, offset);

  in.close();
}